

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

bool __thiscall QRect::contains(QRect *this,QPoint *p,bool proper)

{
  long lVar1;
  bool bVar2;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  lhs;
  byte in_DL;
  long in_FS_OFFSET;
  Representation b;
  Representation t;
  Representation r;
  Representation l;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined5 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff48;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  in_stack_ffffffffffffff4c;
  bool local_a2;
  bool local_a1;
  bool local_69;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::QCheckedIntegers::operator-<int,_true>
            (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff3c);
  bVar2 = QtPrivate::QCheckedIntegers::operator<
                    ((QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                      *)CONCAT44(in_stack_ffffffffffffff4c.m_i,in_stack_ffffffffffffff48),
                     (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                      *)CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT15(in_stack_ffffffffffffff45,
                                                   in_stack_ffffffffffffff40))));
  if (bVar2) {
    QtPrivate::QCheckedIntegers::operator+<int,_true>
              (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff3c);
    QtPrivate::QCheckedIntegers::operator-<int,_true>
              (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff3c);
  }
  if ((in_DL & 1) == 0) {
    QPoint::x((QPoint *)0x627ba8);
    bVar2 = QtPrivate::QCheckedIntegers::operator<<int,_true>
                      ((int *)CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT15(in_stack_ffffffffffffff45,
                                                         in_stack_ffffffffffffff40))),
                       (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                        *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_a2 = true;
    if (!bVar2) {
      QPoint::x((QPoint *)0x627bdb);
      local_a2 = QtPrivate::QCheckedIntegers::operator><int,_true>
                           ((int *)CONCAT17(in_stack_ffffffffffffff47,
                                            CONCAT16(in_stack_ffffffffffffff46,
                                                     CONCAT15(in_stack_ffffffffffffff45,
                                                              in_stack_ffffffffffffff40))),
                            (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                             *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    if (local_a2 != false) {
      local_69 = false;
      goto LAB_00627dd1;
    }
  }
  else {
    QPoint::x((QPoint *)0x627b35);
    bVar2 = QtPrivate::QCheckedIntegers::operator<=<int,_true>
                      ((int *)CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT15(in_stack_ffffffffffffff45,
                                                         in_stack_ffffffffffffff40))),
                       (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                        *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_a1 = true;
    if (!bVar2) {
      QPoint::x((QPoint *)0x627b68);
      local_a1 = QtPrivate::QCheckedIntegers::operator>=<int,_true>
                           ((int *)CONCAT17(in_stack_ffffffffffffff47,
                                            CONCAT16(in_stack_ffffffffffffff46,
                                                     CONCAT15(in_stack_ffffffffffffff45,
                                                              in_stack_ffffffffffffff40))),
                            (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                             *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    if (local_a1 != false) {
      local_69 = false;
      goto LAB_00627dd1;
    }
  }
  QtPrivate::QCheckedIntegers::operator-<int,_true>
            (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff3c);
  bVar2 = QtPrivate::QCheckedIntegers::operator<
                    ((QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                      *)CONCAT44(in_stack_ffffffffffffff4c.m_i,in_stack_ffffffffffffff48),
                     (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                      *)CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT15(in_stack_ffffffffffffff45,
                                                   in_stack_ffffffffffffff40))));
  if (bVar2) {
    lhs = QtPrivate::QCheckedIntegers::operator+<int,_true>
                    (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff3c);
    QtPrivate::QCheckedIntegers::operator-<int,_true>(lhs,in_stack_ffffffffffffff3c);
  }
  if ((in_DL & 1) == 0) {
    QPoint::y((QPoint *)0x627d72);
    bVar2 = QtPrivate::QCheckedIntegers::operator<<int,_true>
                      ((int *)CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT15(in_stack_ffffffffffffff45,
                                                         in_stack_ffffffffffffff40))),
                       (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                        *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    uVar3 = true;
    if (!bVar2) {
      QPoint::y((QPoint *)0x627d9f);
      uVar3 = QtPrivate::QCheckedIntegers::operator><int,_true>
                        ((int *)CONCAT17(in_stack_ffffffffffffff47,
                                         CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff45,
                                                                 in_stack_ffffffffffffff40))),
                         (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                          *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    if ((bool)uVar3 != false) {
      local_69 = false;
      goto LAB_00627dd1;
    }
  }
  else {
    QPoint::y((QPoint *)0x627d0e);
    bVar2 = QtPrivate::QCheckedIntegers::operator<=<int,_true>
                      ((int *)CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT15(in_stack_ffffffffffffff45,
                                                         in_stack_ffffffffffffff40))),
                       (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                        *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    uVar3 = true;
    if (!bVar2) {
      QPoint::y((QPoint *)0x627d3b);
      uVar3 = QtPrivate::QCheckedIntegers::operator>=<int,_true>
                        ((int *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff46,
                                                        CONCAT15(in_stack_ffffffffffffff45,
                                                                 in_stack_ffffffffffffff40))),
                         (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                          *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    if ((bool)uVar3 != false) {
      local_69 = false;
      goto LAB_00627dd1;
    }
  }
  local_69 = true;
LAB_00627dd1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool QRect::contains(const QPoint &p, bool proper) const noexcept
{
    Representation l, r;
    if (x2 < x1 - 1) {
        l = x2 + 1;
        r = x1 - 1;
    } else {
        l = x1;
        r = x2;
    }
    if (proper) {
        if (p.x() <= l || p.x() >= r)
            return false;
    } else {
        if (p.x() < l || p.x() > r)
            return false;
    }
    Representation t, b;
    if (y2 < y1 - 1) {
        t = y2 + 1;
        b = y1 - 1;
    } else {
        t = y1;
        b = y2;
    }
    if (proper) {
        if (p.y() <= t || p.y() >= b)
            return false;
    } else {
        if (p.y() < t || p.y() > b)
            return false;
    }
    return true;
}